

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

unsigned_long CRC32Value(int i)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)i;
  uVar3 = 9;
  do {
    uVar4 = uVar2 >> 1;
    uVar1 = uVar2 & 1;
    uVar2 = uVar4 ^ 0xedb88320;
    if (uVar1 == 0) {
      uVar2 = uVar4;
    }
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return uVar2;
}

Assistant:

unsigned long CRC32Value(int i)
{
    int j;
    unsigned long ulCRC;
    ulCRC = i;
    for ( j = 8 ; j > 0; j-- )
    {
        if ( ulCRC & 1 )
            ulCRC = ( ulCRC >> 1 ) ^ CRC32_POLYNOMIAL;
        else
            ulCRC >>= 1;
    }
    return ulCRC;
}